

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall asl::HttpServer::HttpServer(HttpServer *this,int port)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  undefined1 local_80 [32];
  String local_60;
  String local_48;
  
  SocketServer::SocketServer(&this->super_SocketServer);
  (this->super_SocketServer)._vptr_SocketServer = (_func_int **)&PTR_serve_00154950;
  (this->_webroot)._size = 0;
  (this->_webroot)._len = 0;
  (this->_webroot).field_2._space[0] = '\0';
  String::String(&this->_proto,"HTTP/1.1");
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&this->_mimetypes);
  String::String(&this->_methods,"GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD");
  (this->super_SocketServer)._requestStop = false;
  if (-1 < port) {
    SocketServer::bind(&this->super_SocketServer,port,__addr,in_ECX);
  }
  this->_wsserver = (WebSocketServer *)0x0;
  this->_cors = false;
  String::String(&local_48,
                 "css:text/css,gif:image/gif,htm:text/html,html:text/html,jpeg:image/jpeg,jpg:image/jpeg,js:application/javascript,json:application/json,png:image/png,txt:text/plain,mp4:video/mp4,ogv:video/ogg,webm:video/webm,xml:text/xml"
                );
  String::String(&local_60,',');
  String::String((String *)(local_80 + 8),':');
  String::split((String *)local_80,&local_48,&local_60);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator=
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&this->_mimetypes,
             (Array<asl::Map<asl::String,_asl::String>::KeyVal> *)local_80);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)local_80);
  String::~String((String *)(local_80 + 8));
  String::~String(&local_60);
  String::~String(&local_48);
  return;
}

Assistant:

HttpServer::HttpServer(int port):
	_proto("HTTP/1.1"),
	_methods("GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD")
{
	_requestStop = false;
	if (port >= 0)
		bind(port);
	_wsserver = NULL;
	_cors = false;
	_mimetypes = String(
		"css:text/css,"
		"gif:image/gif,"
		"htm:text/html,"
		"html:text/html,"
		"jpeg:image/jpeg,"
		"jpg:image/jpeg,"
		"js:application/javascript,"
		"json:application/json,"
		"png:image/png,"
		"txt:text/plain,"
		"mp4:video/mp4,"
		"ogv:video/ogg,"
		"webm:video/webm,"
		"xml:text/xml"
		).split(',', ':');
}